

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EdgeDescriptorSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EdgeDescriptorSyntax,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1)

{
  Token t1;
  Token t2;
  EdgeDescriptorSyntax *this_00;
  Token *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (EdgeDescriptorSyntax *)allocate(this,0x30,8);
  t1.kind = args->kind;
  t1._2_1_ = args->field_0x2;
  t1.numFlags.raw = (args->numFlags).raw;
  t1.rawLen = args->rawLen;
  t1.info = args->info;
  t2.kind = args_1->kind;
  t2._2_1_ = args_1->field_0x2;
  t2.numFlags.raw = (args_1->numFlags).raw;
  t2.rawLen = args_1->rawLen;
  t2.info = args_1->info;
  slang::syntax::EdgeDescriptorSyntax::EdgeDescriptorSyntax(this_00,t1,t2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }